

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O2

int __thiscall
anurbs::NurbsSurfaceGeometry<3L>::clone
          (NurbsSurfaceGeometry<3L> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...
          )

{
  long lVar1;
  Scalar *pSVar2;
  Index i;
  long lVar3;
  Index i_2;
  bool local_71;
  Scalar local_70;
  Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_> local_68;
  Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_> local_58;
  long local_48;
  long local_40;
  long local_38;
  
  local_58.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>_>._0_8_
       = (**(code **)(*(long *)__fn + 0x10))(__fn,__fn,__child_stack,___flags);
  local_38 = (**(code **)(*(long *)__fn + 0x18))(__fn);
  lVar3 = *(long *)(__fn + 0x30);
  lVar1 = (**(code **)(*(long *)__fn + 0x10))(__fn);
  local_40 = (lVar3 - lVar1) + 1;
  lVar3 = *(long *)(__fn + 0x40);
  lVar1 = (**(code **)(*(long *)__fn + 0x18))(__fn);
  local_48 = (lVar3 - lVar1) + 1;
  local_71 = *(long *)(__fn + 0x60) != 0;
  new_<anurbs::NurbsSurfaceGeometry<3l>,long,long,long,long,bool>
            ((anurbs *)&local_68,(long *)&local_58,&local_38,&local_40,&local_48,&local_71);
  std::__shared_ptr<anurbs::NurbsSurfaceGeometry<3l>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<anurbs::NurbsSurfaceGeometry<3l>,std::default_delete<anurbs::NurbsSurfaceGeometry<3l>>,void>
            ((__shared_ptr<anurbs::NurbsSurfaceGeometry<3l>,(__gnu_cxx::_Lock_policy)2> *)this,
             (unique_ptr<anurbs::NurbsSurfaceGeometry<3L>,_std::default_delete<anurbs::NurbsSurfaceGeometry<3L>_>_>
              *)&local_68);
  if ((long *)local_68.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_68.
                          super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>_>
                          ._0_8_ + 8))();
  }
  for (lVar3 = 0; lVar3 < *(long *)(__fn + 0x30); lVar3 = lVar3 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)(__fn + 0x28),
                        lVar3);
    local_70 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        ((this->super_SurfaceBase<3L>)._vptr_SurfaceBase + 5),lVar3);
    *pSVar2 = local_70;
  }
  for (lVar3 = 0; lVar3 < *(long *)(__fn + 0x40); lVar3 = lVar3 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)(__fn + 0x38),
                        lVar3);
    local_70 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        ((this->super_SurfaceBase<3L>)._vptr_SurfaceBase + 7),lVar3);
    *pSVar2 = local_70;
  }
  for (lVar3 = 0; lVar1 = *(long *)(__fn + 0x50), lVar3 < lVar1; lVar3 = lVar3 + 1) {
    pole(&local_68,(NurbsSurfaceGeometry<3L> *)__fn,lVar3);
    pole(&local_58,(NurbsSurfaceGeometry<3L> *)(this->super_SurfaceBase<3L>)._vptr_SurfaceBase,lVar3
        );
    Eigen::internal::
    call_assignment<Eigen::Ref<Eigen::Matrix<double,1,3,1,1,3>,0,Eigen::InnerStride<1>>,Eigen::Ref<Eigen::Matrix<double,1,3,1,1,3>,0,Eigen::InnerStride<1>>>
              (&local_58,&local_68);
  }
  if (*(long *)(__fn + 0x60) != 0) {
    for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 1) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          (__fn + 0x58),lVar3);
      local_70 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          ((this->super_SurfaceBase<3L>)._vptr_SurfaceBase + 0xb),lVar3);
      *pSVar2 = local_70;
      lVar1 = *(long *)(__fn + 0x50);
    }
  }
  return (int)this;
}

Assistant:

Pointer<Type> clone()
    {
        Pointer<Type> clone = new_<Type>(
            this->degree_u(), this->degree_v(), this->nb_poles_u(),
            this->nb_poles_v(), this->is_rational());

        for (Index i = 0; i < this->nb_knots_u(); i++) {
            clone->knot_u(i) = this->knot_u(i);
        }

        for (Index i = 0; i < this->nb_knots_v(); i++) {
            clone->knot_v(i) = this->knot_v(i);
        }

        for (Index i = 0; i < this->nb_poles(); i++) {
            clone->pole(i) = this->pole(i);
        }

        if (this->is_rational()) {
            for (Index i = 0; i < this->nb_poles(); i++) {
                clone->weight(i) = this->weight(i);
            }
        }

        return clone;
    }